

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O0

void __thiscall GOESNImageHandler::handle(GOESNImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  bool bVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  element_type *f_00;
  element_type *this_00;
  GOESNImageHandler *in_RDI;
  string path;
  Mat raw;
  FilenameBuilder fb;
  Details details;
  string filename;
  string text;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  value_type first;
  Timer t_1;
  Details db;
  Details da;
  value_type *t;
  mapped_type *vector;
  tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key;
  SegmentIdentificationHeader sih;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_1;
  iterator end_1;
  iterator begin_1;
  Channel channel;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  iterator end;
  iterator begin;
  Region region;
  NOAALRITHeader nlh;
  PrimaryHeader ph;
  File *in_stack_fffffffffffff888;
  FilenameBuilder *in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff8a0;
  string *this_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff8a8;
  NOAALRITHeader *in_stack_fffffffffffff8b0;
  GOESNImageHandler *in_stack_fffffffffffff8b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff8d8;
  iterator in_stack_fffffffffffff8e0;
  iterator in_stack_fffffffffffff8e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff8f0;
  string local_6e0 [16];
  string *in_stack_fffffffffffff930;
  File *in_stack_fffffffffffff938;
  FileWriter *in_stack_fffffffffffff940;
  Mat local_6a0 [7];
  undefined1 in_stack_fffffffffffff967;
  undefined7 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96f;
  Area *in_stack_fffffffffffff970;
  Image *in_stack_fffffffffffff978;
  NOAALRITHeader *in_stack_fffffffffffff980;
  GOESNImageHandler *in_stack_fffffffffffff988;
  Mat local_640 [56];
  string *in_stack_fffffffffffff9f8;
  string *in_stack_fffffffffffffa00;
  FilenameBuilder *in_stack_fffffffffffffa08;
  Mat local_5e0 [48];
  File *in_stack_fffffffffffffa50;
  GOESNImageHandler *in_stack_fffffffffffffa58;
  string local_580 [32];
  string local_560 [248];
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *in_stack_fffffffffffffb98;
  string local_300 [40];
  string local_2d8 [32];
  string local_2b8 [80];
  undefined1 local_268 [24];
  long local_250;
  long local_220;
  reference local_1f0;
  mapped_type *local_188;
  ushort local_126;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined4 local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  NOAALRITHeader local_38;
  char local_24;
  
  std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x294f57);
  lrit::File::getHeader<lrit::PrimaryHeader>((File *)in_stack_fffffffffffff890);
  if (local_24 != '\0') {
    return;
  }
  std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x294f86);
  local_38 = lrit::File::getHeader<lrit::NOAALRITHeader>((File *)0x294f8e);
  if (local_38.productID != in_RDI->productID_) {
    return;
  }
  loadRegion(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff8a0._M_current);
  if (!bVar1) {
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff888);
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff888);
    local_a8 = local_80;
    local_98 = local_b0;
    in_stack_fffffffffffff8f0 =
         std::
         find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                   (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
    local_a0 = in_stack_fffffffffffff8f0._M_current;
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff890,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff888);
    if (bVar1) {
      local_b4 = 1;
      goto LAB_00295a17;
    }
  }
  loadChannel(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff8a0._M_current);
  if (bVar1) {
LAB_002951f6:
    std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x295203);
    bVar1 = lrit::File::hasHeader<lrit::SegmentIdentificationHeader>((File *)0x29520b);
    if (bVar1) {
      std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x295238);
      lrit::File::getHeader<lrit::SegmentIdentificationHeader>((File *)in_stack_fffffffffffff890);
      std::make_tuple<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string&>
                ((char (*) [7])CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 &in_stack_fffffffffffff890->dir,&in_stack_fffffffffffff888->file_);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff890,
                 (tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff888);
      pmVar2 = std::
               unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>_>_>
               ::operator[]((unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>_>_>
                             *)in_stack_fffffffffffff890,(key_type *)in_stack_fffffffffffff888);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2952c0);
      local_188 = pmVar2;
      bVar1 = std::
              vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
              ::empty((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                       *)in_stack_fffffffffffff8a0._M_current);
      if (!bVar1) {
        local_1f0 = std::
                    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                    ::front((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                             *)in_stack_fffffffffffff890);
        std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )in_stack_fffffffffffff890);
        loadDetails(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )in_stack_fffffffffffff890);
        loadDetails(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        if (local_220 != local_250) {
          std::
          vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
          ::clear((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                   *)0x295364);
        }
        Details::~Details((Details *)0x2953d8);
        Details::~Details((Details *)0x2953e5);
      }
      std::shared_ptr<const_lrit::File>::shared_ptr
                ((shared_ptr<const_lrit::File> *)in_stack_fffffffffffff890,
                 (shared_ptr<const_lrit::File> *)in_stack_fffffffffffff888);
      anon_unknown.dwarf_c2ff1::insertSegment
                ((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  *)in_stack_fffffffffffff8f0._M_current,
                 (shared_ptr<const_lrit::File> *)in_stack_fffffffffffff8e8._M_current);
      std::shared_ptr<const_lrit::File>::~shared_ptr((shared_ptr<const_lrit::File> *)0x29542a);
      sVar3 = std::
              vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
              ::size(local_188);
      if (sVar3 == local_126) {
        Timer::Timer((Timer *)in_stack_fffffffffffff890);
        std::
        vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
        ::front((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                 *)in_stack_fffffffffffff890);
        std::shared_ptr<const_lrit::File>::shared_ptr
                  ((shared_ptr<const_lrit::File> *)in_stack_fffffffffffff890,
                   (shared_ptr<const_lrit::File> *)in_stack_fffffffffffff888);
        std::
        vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
        ::vector((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  *)in_stack_fffffffffffff8e0._M_current,
                 (vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  *)in_stack_fffffffffffff8d8._M_current);
        Image::createFromFiles(in_stack_fffffffffffffb98);
        std::
        vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
        ::~vector((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                   *)in_stack_fffffffffffff8a0._M_current);
        std::
        vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
        ::clear((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                 *)0x2954bc);
        std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2954c9);
        lrit::File::getHeader<lrit::AnnotationHeader>(in_stack_fffffffffffff888);
        std::__cxx11::string::string(local_2b8,local_2d8);
        lrit::AnnotationHeader::~AnnotationHeader((AnnotationHeader *)0x295502);
        removeSuffix((string *)CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
        std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )in_stack_fffffffffffff890);
        loadDetails(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        this_01 = local_580;
        FilenameBuilder::FilenameBuilder(in_stack_fffffffffffff890);
        std::__cxx11::string::operator=(this_01,(string *)&(in_RDI->config_).dir);
        std::__cxx11::string::operator=(local_560,local_300);
        Region::operator=((Region *)in_stack_fffffffffffff890,(Region *)in_stack_fffffffffffff888);
        Channel::operator=((Channel *)in_stack_fffffffffffff890,(Channel *)in_stack_fffffffffffff888
                          );
        cv::Mat::Mat(local_5e0);
        bVar1 = Area::empty((Area *)in_stack_fffffffffffff890);
        if (bVar1) {
          std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                    ((unique_ptr<Image,_std::default_delete<Image>_> *)0x295600);
          Image::getScaledImage
                    ((Image *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                     (bool)in_stack_fffffffffffff967);
          cv::Mat::operator=(local_5e0,local_640);
          cv::Mat::~Mat(local_640);
        }
        else {
          std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                    ((unique_ptr<Image,_std::default_delete<Image>_> *)0x295752);
          Image::getScaledImage
                    (in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                     (bool)in_stack_fffffffffffff96f);
          cv::Mat::operator=(local_5e0,local_6a0);
          cv::Mat::~Mat(local_6a0);
        }
        f_00 = std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffff890);
        overlayMaps(in_RDI,f_00,&(in_RDI->config_).crop,local_5e0);
        in_stack_fffffffffffff890 = (FilenameBuilder *)&(in_RDI->config_).filename;
        std::__cxx11::string::string(local_6e0,(string *)&(in_RDI->config_).format);
        FilenameBuilder::build
                  (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
        std::__cxx11::string::~string(local_6e0);
        this_00 = std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x295863);
        FileWriter::write(this_00,(int)&stack0xfffffffffffff940,local_5e0,(size_t)local_268);
        if (((in_RDI->config_).json & 1U) != 0) {
          std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x2958ae);
          std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffff890);
          FileWriter::writeHeader
                    (in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930);
        }
        local_b4 = 1;
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff940);
        cv::Mat::~Mat(local_5e0);
        FilenameBuilder::~FilenameBuilder(in_stack_fffffffffffff890);
        Details::~Details((Details *)0x29595f);
        std::__cxx11::string::~string(local_300);
        std::__cxx11::string::~string(local_2b8);
        std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)this_01);
        std::shared_ptr<const_lrit::File>::~shared_ptr((shared_ptr<const_lrit::File> *)0x295993);
      }
      else {
        local_b4 = 0;
      }
      std::
      tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple((tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x295a0a);
    }
    else {
      local_b4 = 1;
    }
  }
  else {
    in_stack_fffffffffffff8e8 =
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff888);
    local_100 = in_stack_fffffffffffff8e8._M_current;
    in_stack_fffffffffffff8e0 =
         std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff888);
    local_118 = local_100;
    local_120 = in_stack_fffffffffffff8e0._M_current;
    local_108 = in_stack_fffffffffffff8e0._M_current;
    in_stack_fffffffffffff8d8 =
         std::
         find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                   (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
    local_110 = in_stack_fffffffffffff8d8._M_current;
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff890,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff888);
    if (!bVar1) goto LAB_002951f6;
    local_b4 = 1;
  }
  Channel::~Channel((Channel *)in_stack_fffffffffffff890);
LAB_00295a17:
  Region::~Region((Region *)in_stack_fffffffffffff890);
  return;
}

Assistant:

void GOESNImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter by product
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != productID_) {
    return;
  }

  // Filter by region
  auto region = loadRegion(nlh);
  if (!config_.regions.empty()) {
    auto begin = std::begin(config_.regions);
    auto end = std::end(config_.regions);
    auto it = std::find(begin, end, region.nameShort);
    if (it == end) {
      return;
    }
  }

  // Filter by channel
  auto channel = loadChannel(nlh);
  if (!config_.channels.empty()) {
    auto begin = std::begin(config_.channels);
    auto end = std::end(config_.channels);
    auto it = std::find(begin, end, channel.nameShort);
    if (it == end) {
      return;
    }
  }

  // Assume all images are segmented
  if (!f->hasHeader<lrit::SegmentIdentificationHeader>()) {
    return;
  }

  auto sih = f->getHeader<lrit::SegmentIdentificationHeader>();
  auto key = std::make_tuple("unused", region.nameShort, channel.nameShort);
  auto& vector = segments_[key];

  // Ensure we can append this segment
  if (!vector.empty()) {
    const auto& t = vector.front();

    // Use "Time of frame start" field in ancillary text header to
    // check that this segment belongs to the set of existing ones.
    // Previously this was done with the segment identification
    // header, but a ground station update in August 2018 introduced
    // an error where segments of the same image often don't share the
    // same image identification header. This is only the case for the
    // GOES-16 (possibly also GOES-17) relay of GOES-15 on HRIT.
    auto da = loadDetails(*f);
    auto db = loadDetails(*t);
    if (da.frameStart.tv_sec != db.frameStart.tv_sec) {
      vector.clear();
    }
  }

  insertSegment(vector, f);
  if (vector.size() == sih.maxSegment) {
    Timer t;

    auto first = vector.front();
    auto image = Image::createFromFiles(vector);
    vector.clear();

    auto text = first->getHeader<lrit::AnnotationHeader>().text;
    auto filename = removeSuffix(text);
    auto details = loadDetails(*first);

    FilenameBuilder fb;
    fb.dir = config_.dir;
    fb.filename = filename;
    fb.time = details.frameStart;
    fb.region = region;
    fb.channel = channel;

    cv::Mat raw;
    if (config_.crop.empty()) {
      raw = image->getScaledImage(false);
    } else {
      raw = image->getScaledImage(config_.crop, false);
    }

    overlayMaps(*first, config_.crop, raw);
    auto path = fb.build(config_.filename, config_.format);
    fileWriter_->write(path, raw, &t);
    if (config_.json) {
      fileWriter_->writeHeader(*first, path);
    }
    return;
  }
}